

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O2

int CVmObjList::getp_splice(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *in_argc)

{
  ushort uVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  vm_obj_id_t vVar8;
  uint uVar9;
  ulong uVar10;
  size_t idx;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  CVmObjPageEntry *this;
  
  if (in_argc == (uint *)0x0) {
    uVar13 = 0;
  }
  else {
    uVar13 = (ulong)*in_argc;
  }
  if (getp_splice(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    iVar5 = __cxa_guard_acquire(&getp_splice(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                                 desc);
    if (iVar5 != 0) {
      getp_splice::desc.min_argc_ = 2;
      getp_splice::desc.opt_argc_ = 0;
      getp_splice::desc.varargs_ = 1;
      __cxa_guard_release(&getp_splice(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
    }
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,in_argc,&getp_splice::desc);
  if (iVar5 == 0) {
    uVar1 = *(ushort *)lst;
    iVar6 = CVmBif::pop_int_val();
    iVar7 = CVmBif::pop_int_val();
    pvVar4 = sp_;
    iVar5 = uVar1 + 1;
    if (0 < iVar6) {
      iVar5 = 0;
    }
    uVar9 = (iVar5 + iVar6) - 1;
    if ((int)(uint)uVar1 <= (int)uVar9) {
      uVar9 = (uint)uVar1;
    }
    uVar11 = 0;
    if (0 < iVar5 + iVar6) {
      uVar11 = uVar9;
    }
    iVar5 = uVar1 - uVar11;
    if (iVar7 < (int)(uVar1 - uVar11)) {
      iVar5 = iVar7;
    }
    if (iVar7 < 0) {
      iVar5 = 0;
    }
    iVar6 = (int)uVar13 + -2;
    if (iVar5 == 0 && iVar6 == 0) {
      uVar3 = *(undefined4 *)&self_val->field_0x4;
      aVar2 = self_val->val;
      retval->typ = self_val->typ;
      *(undefined4 *)&retval->field_0x4 = uVar3;
      retval->val = aVar2;
    }
    else {
      uVar3 = *(undefined4 *)&self_val->field_0x4;
      aVar2 = self_val->val;
      sp_ = sp_ + 1;
      pvVar4->typ = self_val->typ;
      *(undefined4 *)&pvVar4->field_0x4 = uVar3;
      pvVar4->val = aVar2;
      uVar14 = 0;
      vVar8 = create(0,(long)(int)((iVar6 + (uint)uVar1) - iVar5));
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar8;
      pvVar4 = sp_;
      this = G_obj_table_X.pages_[vVar8 >> 0xc] + (vVar8 & 0xfff);
      uVar3 = *(undefined4 *)&retval->field_0x4;
      aVar2 = retval->val;
      sp_ = sp_ + 1;
      pvVar4->typ = retval->typ;
      *(undefined4 *)&pvVar4->field_0x4 = uVar3;
      pvVar4->val = aVar2;
      if (0 < (int)uVar11) {
        memcpy((void *)(*(long *)((long)&this->ptr_ + 8) + 2),lst + 2,(ulong)uVar11 * 5);
        uVar14 = (ulong)uVar9;
      }
      lVar12 = -0x30;
      for (uVar10 = 2; idx = (uVar10 - 2) + uVar14, uVar10 < uVar13; uVar10 = uVar10 + 1) {
        cons_set_element((CVmObjList *)this,idx,(vm_val_t *)((long)&sp_->typ + lVar12));
        lVar12 = lVar12 + -0x10;
      }
      iVar5 = iVar5 + uVar11;
      if (iVar5 < (int)(uint)uVar1) {
        memcpy((void *)(*(long *)((long)&this->ptr_ + 8) + (idx & 0xffffffff) * 5 + 2),
               lst + (long)iVar5 * 5 + 2,((ulong)uVar1 - (long)iVar5) * 5);
      }
      sp_ = sp_ + -(long)(int)uVar13;
    }
  }
  return 1;
}

Assistant:

int CVmObjList::getp_splice(VMG_ vm_val_t *retval,
                            const vm_val_t *self_val,
                            const char *lst, uint *in_argc)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(2, 0, TRUE);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* remember the length of my list */
    int lst_cnt = vmb_get_len(lst);

    /* retrieve the starting index and deletion length arguments */
    int start_idx = CVmBif::pop_int_val(vmg0_);
    int del_cnt = CVmBif::pop_int_val(vmg0_);

    /* a negative starting index counts from the end of the list */
    if (start_idx <= 0)
        start_idx += lst_cnt + 1;

    /* adjust to zero-based indexing */
    --start_idx;

    /* make sure the values are in range */
    start_idx = (start_idx < 0 ? 0 :
                 start_idx > lst_cnt ? lst_cnt :
                 start_idx);
    del_cnt = (del_cnt < 0 ? 0 :
               del_cnt > lst_cnt - start_idx ? lst_cnt - start_idx :
               del_cnt);

    /* figure the insertion size: each argument is a value to insert */
    int ins_cnt = argc - 2;

    /* if we're making any changes, build the new list */
    if (del_cnt != 0 || ins_cnt != 0)
    {
        /* put myself on the stack for GC protection */
        G_stk->push(self_val);

        /* create a list to store the return value */
        retval->set_obj(create(vmg_ FALSE, lst_cnt + ins_cnt - del_cnt));
        CVmObjList *new_lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

        /* push a reference to the new list for gc protection */
        G_stk->push(retval);
        
        /* copy elements from the original up to the starting index */
        int dst = 0;
        if (start_idx > 0)
        {
            new_lst->cons_copy_data(0, lst + VMB_LEN, start_idx);
            dst = start_idx;
        }
        
        /* 
         *   Add the inserted items from the arguments.  We popped our first
         *   two arguments, but then we pushed two items for gc protection,
         *   so conveniently the inserted items are just args 2..argc-1 
         */
        for (uint i = 2 ; i < argc ; ++i)
            new_lst->cons_set_element(dst++, G_stk->get(i));
        
        /* copy the remaining elements after the deleted segment, if any */
        if (lst_cnt > start_idx + del_cnt)
        {
            new_lst->cons_copy_data(
                dst, get_element_ptr_const(lst, start_idx + del_cnt),
                lst_cnt - (start_idx + del_cnt));
        }   
        
        /* 
         *   Discard the gc protection and insertion arguments.  We added two
         *   elements for gc protection, and popped two arguments, so the net
         *   is the original argument count.  
         */
        G_stk->discard(argc);
    }
    else
    {
        /* 
         *   There's nothing to do - just return the original list.  (There's
         *   nothing to discard from the stack: we have no more arguments,
         *   since ins_cnt is zero, and we haven't pushed any gc protection
         *   elements.) 
         */
        *retval = *self_val;
    }

    /* handled */
    return TRUE;
}